

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

void repTextCopy(UText *ut,int64_t start,int64_t limit,int64_t destIndex,UBool move,
                UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  Replaceable *pRVar3;
  UBool UVar4;
  uint local_ac;
  uint local_a8;
  int32_t nativeIterIndex;
  int32_t firstAffectedIndex;
  UnicodeString local_98;
  int local_54;
  uint local_50;
  int32_t segLength;
  int32_t destIndex32;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  Replaceable *rep;
  UErrorCode *status_local;
  int64_t iStack_28;
  UBool move_local;
  int64_t destIndex_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  _start32 = (Replaceable *)ut->context;
  rep = (Replaceable *)status;
  status_local._7_1_ = move;
  iStack_28 = destIndex;
  destIndex_local = limit;
  limit_local = start;
  start_local = (int64_t)ut;
  limit32 = icu_63::Replaceable::length(_start32);
  UVar4 = U_FAILURE(*(UErrorCode *)&(rep->super_UObject)._vptr_UObject);
  if (UVar4 == '\0') {
    if ((destIndex_local < limit_local) ||
       ((limit_local < iStack_28 && (iStack_28 < destIndex_local)))) {
      *(undefined4 *)&(rep->super_UObject)._vptr_UObject = 8;
    }
    else {
      destIndex32 = pinIndex(&limit_local,(long)limit32);
      segLength = pinIndex(&destIndex_local,(long)limit32);
      local_50 = pinIndex(&stack0xffffffffffffffd8,(long)limit32);
      if (status_local._7_1_ == '\0') {
        (*(_start32->super_UObject)._vptr_UObject[5])
                  (_start32,(ulong)(uint)destIndex32,(ulong)(uint)segLength,(ulong)local_50);
      }
      else {
        local_54 = segLength - destIndex32;
        (*(_start32->super_UObject)._vptr_UObject[5])
                  (_start32,(ulong)(uint)destIndex32,(ulong)(uint)segLength,(ulong)local_50);
        pRVar3 = _start32;
        if ((int)local_50 < destIndex32) {
          destIndex32 = local_54 + destIndex32;
          segLength = local_54 + segLength;
        }
        iVar2 = destIndex32;
        iVar1 = segLength;
        icu_63::UnicodeString::UnicodeString(&local_98);
        (*(pRVar3->super_UObject)._vptr_UObject[4])
                  (pRVar3,(ulong)(uint)iVar2,(ulong)(uint)iVar1,&local_98);
        icu_63::UnicodeString::~UnicodeString(&local_98);
      }
      local_a8 = local_50;
      if ((status_local._7_1_ != '\0') && (destIndex32 < (int)local_50)) {
        local_a8 = destIndex32;
      }
      if ((long)(int)local_a8 < *(long *)(start_local + 0x10)) {
        invalidateChunk((UText *)start_local);
      }
      local_ac = (local_50 + segLength) - destIndex32;
      if ((status_local._7_1_ != '\0') && (destIndex32 < (int)local_50)) {
        local_ac = local_50;
      }
      repTextAccess((UText *)start_local,(long)(int)local_ac,'\x01');
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
repTextCopy(UText *ut,
                int64_t start, int64_t limit,
                int64_t destIndex,
                UBool move,
                UErrorCode *status)
{
    Replaceable *rep=(Replaceable *)ut->context;
    int32_t length=rep->length();

    if(U_FAILURE(*status)) {
        return;
    }
    if (start>limit || (start<destIndex && destIndex<limit))
    {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    int32_t start32     = pinIndex(start, length);
    int32_t limit32     = pinIndex(limit, length);
    int32_t destIndex32 = pinIndex(destIndex, length);

    // TODO:  snap input parameters to code point boundaries.

    if(move) {
        // move: copy to destIndex, then replace original with nothing
        int32_t segLength=limit32-start32;
        rep->copy(start32, limit32, destIndex32);
        if(destIndex32<start32) {
            start32+=segLength;
            limit32+=segLength;
        }
        rep->handleReplaceBetween(start32, limit32, UnicodeString());
    } else {
        // copy
        rep->copy(start32, limit32, destIndex32);
    }

    // If the change to the text touched the region in the chunk buffer,
    //  invalidate the buffer.
    int32_t firstAffectedIndex = destIndex32;
    if (move && start32<firstAffectedIndex) {
        firstAffectedIndex = start32;
    }
    if (firstAffectedIndex < ut->chunkNativeLimit) {
        // changes may have affected range covered by the chunk
        invalidateChunk(ut);
    }

    // Put iteration position at the newly inserted (moved) block,
    int32_t  nativeIterIndex = destIndex32 + limit32 - start32;
    if (move && destIndex32>start32) {
        // moved a block of text towards the end of the string.
        nativeIterIndex = destIndex32;
    }

    // Set position, reload chunk if needed.
    repTextAccess(ut, nativeIterIndex, TRUE);
}